

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O0

bool __thiscall
StringKMerFactory::create_kmers
          (StringKMerFactory *this,string *s,
          vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
          *mers)

{
  bool *__args;
  uint64_t *puVar1;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_> *in_RDX;
  KMerFactory *in_RSI;
  unsigned_long *in_RDI;
  uint64_t p;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  uint64_t *puVar2;
  uint64_t *rkmer;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_> *__n;
  
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[1] = 0;
  puVar2 = (uint64_t *)0x0;
  __n = in_RDX;
  __args = (bool *)std::
                   vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                   ::size(in_RDX);
  std::__cxx11::string::size();
  std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  reserve((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
           *)in_RSI,(size_type)__n);
  while (rkmer = puVar2, puVar1 = (uint64_t *)std::__cxx11::string::size(), puVar2 < puVar1) {
    std::__cxx11::string::operator[]((ulong)in_RSI);
    KMerFactory::fillKBuf
              (in_RSI,(uchar)((ulong)__n >> 0x38),rkmer,
               (uint64_t *)
               CONCAT17(in_stack_ffffffffffffffdf,
                        CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),
               (int64_t *)in_RDX);
    puVar2 = (uint64_t *)((long)rkmer + 1);
    if ((long)(ulong)(byte)*in_RDI <= (long)in_RDI[1]) {
      if (in_RDI[3] < in_RDI[2]) {
        in_stack_ffffffffffffffde = 0;
        std::vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>::
        emplace_back<bool,unsigned_long&>(in_RDX,__args,in_RDI);
      }
      else {
        in_stack_ffffffffffffffdf = 1;
        std::vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>::
        emplace_back<bool,unsigned_long&>(in_RDX,__args,in_RDI);
      }
    }
  }
  return false;
}

Assistant:

const bool create_kmers(const std::string &s, std::vector<std::pair<bool, uint64_t>> &mers) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        mers.reserve(mers.size()+s.size());
        while (p < s.size()) {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                if (fkmer <= rkmer) {
                    // Is fwd
                    mers.emplace_back(true, fkmer);
                } else {
                    // Is bwd
                    mers.emplace_back(false, rkmer);
                }
            }
        }
        return false;
    }